

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

char * scanf_fmtstr(char *src,char *type)

{
  char cVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char *pcVar4;
  int exp;
  long lVar5;
  char tmp;
  char i32 [6];
  
  lVar5 = 0;
  while( true ) {
    cVar1 = src[lVar5];
    if (((long)cVar1 == 0) || (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[cVar1] >> 0xd & 1) != 0))
    break;
    if (cVar1 == '.') {
      if ((src[lVar5 + 1] == '.') && (src[lVar5 + 2] == '.')) break;
    }
    else if ((cVar1 == ')') || (cVar1 == ']')) break;
    lVar5 = lVar5 + 1;
  }
  pcVar4 = &tmp;
  if (type != (char *)0x0) {
    pcVar4 = type;
  }
  builtin_strncpy(i32,"%*i%n",6);
  exp = (int)lVar5;
  pcVar3 = try_fmt(src,exp,"%*lih%n",pcVar4,'h');
  if ((((pcVar3 == (char *)0x0) &&
       (pcVar3 = try_fmt(src,exp,"%*d%n",pcVar4,'i'), pcVar3 == (char *)0x0)) &&
      (pcVar3 = try_fmt(src,exp,"%*ii%n",pcVar4,'i'), pcVar3 == (char *)0x0)) &&
     (((pcVar3 = try_fmt(src,exp,i32,pcVar4,'i'), pcVar3 == (char *)0x0 &&
       (pcVar3 = try_fmt(src,exp,"%*lfd%n",pcVar4,'d'), pcVar3 == (char *)0x0)) &&
      (pcVar3 = try_fmt(src,exp,"%*ff%n",pcVar4,'f'), pcVar3 == (char *)0x0)))) {
    pcVar3 = try_fmt(src,exp,"%*f%n",pcVar4,'f');
  }
  pcVar4 = "%*x%n";
  if (pcVar3 != i32) {
    pcVar4 = pcVar3;
  }
  return pcVar4;
}

Assistant:

static const char* scanf_fmtstr(const char* src, char* type)
{
    const char* end = src;
    // skip to string end, word end or a closing parenthesis
    for(; *end && !isspace(*end) && (*end != ')') && (*end != ']')
               && strncmp(end, "...", 3); ++end);

    int exp = end - src;

    // store type byte in the parameter, or in a temporary variable?
    char tmp;
    char* _type = type ? type : &tmp;

    const char i32[] = "%*"PRIi32"%n";

    const char* r; // result
    int ok = (r = try_fmt(src, exp, "%*"PRIi64"h%n", _type, 'h'))
          || (r = try_fmt(src, exp, "%*d%n", _type, 'i'))
          || (r = try_fmt(src, exp, "%*"PRIi32"i%n", _type, 'i'))
          || (r = try_fmt(src, exp, i32, _type, 'i'))
          || (r = try_fmt(src, exp, "%*lfd%n", _type, 'd'))
          || (r = try_fmt(src, exp, "%*ff%n", _type, 'f'))
          || (r = try_fmt(src, exp, "%*f%n", _type, 'f'));
    (void)ok;
    if(r == i32)
        r = "%*x%n";
    return r;
}